

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::IntegrationTest_shouldSendBodyAsUtf8_Test::
~IntegrationTest_shouldSendBodyAsUtf8_Test(IntegrationTest_shouldSendBodyAsUtf8_Test *this)

{
  function<void_(void_*)> *pfVar1;
  pointer pcVar2;
  _Manager_type p_Var3;
  
  (this->super_IntegrationTest).super_Test._vptr_Test = (_func_int **)&PTR__IntegrationTest_0018fd80
  ;
  pcVar2 = (this->super_IntegrationTest).default_metrics_path_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_IntegrationTest).default_metrics_path_.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->super_IntegrationTest).base_url_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_IntegrationTest).base_url_.field_2) {
    operator_delete(pcVar2);
  }
  std::unique_ptr<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>::~unique_ptr
            (&(this->super_IntegrationTest).exposer_);
  p_Var3 = (this->super_IntegrationTest).fetchPrePerform_.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    pfVar1 = &(this->super_IntegrationTest).fetchPrePerform_;
    (*p_Var3)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(IntegrationTest, shouldSendBodyAsUtf8) {
  const std::string counter_name = "example_total";
  auto registry = RegisterSomeCounter(counter_name, default_metrics_path_);

  const auto metrics = FetchMetrics(default_metrics_path_);

  // check content type

  ASSERT_EQ(metrics.code, 200);
  EXPECT_THAT(metrics.contentType, HasSubstr("utf-8"));
}